

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 6522Implementation.hpp
# Opt level: O2

void __thiscall
MOS::MOS6522::
MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::VIAPortHandler>
::do_phase2(MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::VIAPortHandler>
            *this)

{
  uint16_t uVar1;
  int iVar2;
  byte bVar3;
  uint16_t uVar4;
  
  (this->time_since_bus_handler_call_).super_WrappedInt<HalfCycles>.length_ =
       (this->time_since_bus_handler_call_).super_WrappedInt<HalfCycles>.length_ + 1;
  uVar4 = (this->super_MOS6522Storage).registers_.timer[0];
  uVar1 = (this->super_MOS6522Storage).registers_.timer[1];
  (this->super_MOS6522Storage).registers_.last_timer[0] = uVar4;
  (this->super_MOS6522Storage).registers_.last_timer[1] = uVar1;
  if ((this->super_MOS6522Storage).registers_.timer_needs_reload == true) {
    (this->super_MOS6522Storage).registers_.timer_needs_reload = false;
    uVar4 = (this->super_MOS6522Storage).registers_.timer_latch[0];
  }
  else {
    uVar4 = uVar4 - 1;
  }
  (this->super_MOS6522Storage).registers_.timer[0] = uVar4;
  (this->super_MOS6522Storage).registers_.timer[1] =
       uVar1 - (((this->super_MOS6522Storage).registers_.auxiliary_control & 0x20) == 0);
  iVar2 = (this->super_MOS6522Storage).registers_.next_timer[0];
  if (-1 < iVar2) {
    (this->super_MOS6522Storage).registers_.timer[0] = (uint16_t)iVar2;
    (this->super_MOS6522Storage).registers_.next_timer[0] = -1;
  }
  iVar2 = (this->super_MOS6522Storage).registers_.next_timer[1];
  if (-1 < iVar2) {
    (this->super_MOS6522Storage).registers_.timer[1] = (uint16_t)iVar2;
    (this->super_MOS6522Storage).registers_.next_timer[1] = -1;
  }
  if ((this->super_MOS6522Storage).handshake_modes_[1] == Pulse) {
    (this->super_MOS6522Storage).control_outputs_[1].lines[1] = On;
    evaluate_cb2_output(this);
  }
  if ((this->super_MOS6522Storage).handshake_modes_[0] == Pulse) {
    set_control_line_output(this,A,Two,On);
  }
  bVar3 = (this->super_MOS6522Storage).registers_.auxiliary_control >> 2 & 7;
  if (bVar3 != 6) {
    if (bVar3 == 2) {
      shift_in(this);
      return;
    }
    return;
  }
  shift_out(this);
  return;
}

Assistant:

void MOS6522<T>::do_phase2() {
	++ time_since_bus_handler_call_;

	registers_.last_timer[0] = registers_.timer[0];
	registers_.last_timer[1] = registers_.timer[1];

	if(registers_.timer_needs_reload) {
		registers_.timer_needs_reload = false;
		registers_.timer[0] = registers_.timer_latch[0];
	} else {
		-- registers_.timer[0];
	}

	// Count down timer 2 if it is in timed interrupt mode (i.e. auxiliary control bit 5 is clear).
	registers_.timer[1] -= timer2_clock_decrement();

	// TODO: can eliminate conditional branches here.
	if(registers_.next_timer[0] >= 0) {
		registers_.timer[0] = uint16_t(registers_.next_timer[0]);
		registers_.next_timer[0] = -1;
	}
	if(registers_.next_timer[1] >= 0) {
		registers_.timer[1] = uint16_t(registers_.next_timer[1]);
		registers_.next_timer[1] = -1;
	}

	// In pulse modes, CA2 and CB2 go high again on the next clock edge.
	if(handshake_modes_[1] == HandshakeMode::Pulse) {
		set_control_line_output(Port::B, Line::Two, LineState::On);
	}
	if(handshake_modes_[0] == HandshakeMode::Pulse) {
		set_control_line_output(Port::A, Line::Two, LineState::On);
	}

	// If the shift register is shifting according to the input clock, do a shift.
	switch(shift_mode()) {
		default:											break;
		case ShiftMode::InUnderPhase2:		shift_in();		break;
		case ShiftMode::OutUnderPhase2:		shift_out();	break;
	}
}